

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O1

void duckdb::FixedSizeScan<duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result)

{
  idx_t iVar1;
  idx_t iVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  pointer pSVar5;
  
  pSVar5 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  iVar1 = state->row_index;
  iVar2 = (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar5 + 3));
  p_Var3 = pSVar5[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  Vector::SetVectorType(result,FLAT_VECTOR);
  result->data = (data_ptr_t)(p_Var3 + (iVar1 - iVar2) * 0x10 + iVar4);
  return;
}

Assistant:

void FixedSizeScan(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result) {
	auto &scan_state = state.scan_state->template Cast<FixedSizeScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto source_data = data + start * sizeof(T);

	result.SetVectorType(VectorType::FLAT_VECTOR);
	FlatVector::SetData(result, source_data);
}